

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_wString __thiscall ON_RenderContent::XML(ON_RenderContent *this,bool recursive)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  wchar_t *s;
  byte in_DL;
  undefined7 in_register_00000031;
  wchar_t *stream;
  ON_XMLNode *pOStack_28;
  ON__UINT32 logical_count;
  ON_XMLNode *node;
  bool recursive_local;
  ON_RenderContent *this_local;
  ON_wString *xml;
  
  pOStack_28 = &((ON_RenderContent *)CONCAT71(in_register_00000031,recursive))->_private->m_node;
  if ((in_DL & 1) != 0) {
    pOStack_28 = ON_RenderContentPrivate::NewXMLNodeRecursive
                           ((ON_RenderContent *)CONCAT71(in_register_00000031,recursive));
  }
  uVar2 = (*pOStack_28->_vptr_ON_XMLNode[0x1b])(pOStack_28,0,0,1,0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)uVar2 + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  s = (wchar_t *)operator_new__(uVar3);
  (*pOStack_28->_vptr_ON_XMLNode[0x1b])(pOStack_28,s,(ulong)uVar2,1,0);
  s[uVar2] = L'\0';
  ON_wString::ON_wString((ON_wString *)this,s);
  if (s != (wchar_t *)0x0) {
    operator_delete__(s);
  }
  if (((in_DL & 1) != 0) && (pOStack_28 != (ON_XMLNode *)0x0)) {
    (*pOStack_28->_vptr_ON_XMLNode[1])();
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_RenderContent::XML(bool recursive) const
{
  ON_XMLNode* node = &_private->m_node;

  if (recursive)
  {
    node = ON_RenderContentPrivate::NewXMLNodeRecursive(*this);
  }

  const ON__UINT32 logical_count = node->WriteToStream(nullptr, 0);
  auto* stream = new wchar_t[size_t(logical_count) + 1];
  node->WriteToStream(stream, logical_count);
  stream[logical_count] = 0;
  const ON_wString xml = stream;
  delete[] stream;

  if (recursive)
    delete node;

  return xml;
}